

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes_modes.c
# Opt level: O0

int aes_cbc_decrypt(uchar *ibuf,uchar *obuf,int len,uchar *iv,aes_decrypt_ctx *ctx)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  int local_4c;
  int nb;
  uchar tmp [16];
  aes_decrypt_ctx *ctx_local;
  uchar *iv_local;
  uint *puStack_20;
  int len_local;
  uchar *obuf_local;
  uchar *ibuf_local;
  
  local_4c = len >> 4;
  if ((len & 0xfU) == 0) {
    puStack_20 = (uint *)obuf;
    obuf_local = ibuf;
    if ((((ulong)obuf & 3) == 0) && (((ulong)iv & 3) == 0)) {
      while (local_4c != 0) {
        uVar1 = *(undefined8 *)obuf_local;
        uVar2 = *(undefined8 *)(obuf_local + 8);
        iVar3 = aes_decrypt(obuf_local,(uchar *)puStack_20,ctx);
        if (iVar3 != 0) {
          return 1;
        }
        *puStack_20 = *(uint *)iv ^ *puStack_20;
        puStack_20[1] = *(uint *)(iv + 4) ^ puStack_20[1];
        puStack_20[2] = *(uint *)(iv + 8) ^ puStack_20[2];
        puStack_20[3] = *(uint *)(iv + 0xc) ^ puStack_20[3];
        *(undefined8 *)iv = uVar1;
        *(undefined8 *)(iv + 8) = uVar2;
        obuf_local = obuf_local + 0x10;
        puStack_20 = puStack_20 + 4;
        local_4c = local_4c + -1;
      }
    }
    else {
      while (local_4c != 0) {
        uVar1 = *(undefined8 *)obuf_local;
        uVar2 = *(undefined8 *)(obuf_local + 8);
        iVar3 = aes_decrypt(obuf_local,(uchar *)puStack_20,ctx);
        if (iVar3 != 0) {
          return 1;
        }
        *(byte *)puStack_20 = *(byte *)puStack_20 ^ *iv;
        *(byte *)((long)puStack_20 + 1) = *(byte *)((long)puStack_20 + 1) ^ iv[1];
        *(byte *)((long)puStack_20 + 2) = *(byte *)((long)puStack_20 + 2) ^ iv[2];
        *(byte *)((long)puStack_20 + 3) = *(byte *)((long)puStack_20 + 3) ^ iv[3];
        *(byte *)((long)puStack_20 + 4) = *(byte *)((long)puStack_20 + 4) ^ iv[4];
        *(byte *)((long)puStack_20 + 5) = *(byte *)((long)puStack_20 + 5) ^ iv[5];
        *(byte *)((long)puStack_20 + 6) = *(byte *)((long)puStack_20 + 6) ^ iv[6];
        *(byte *)((long)puStack_20 + 7) = *(byte *)((long)puStack_20 + 7) ^ iv[7];
        *(byte *)((long)puStack_20 + 8) = *(byte *)((long)puStack_20 + 8) ^ iv[8];
        *(byte *)((long)puStack_20 + 9) = *(byte *)((long)puStack_20 + 9) ^ iv[9];
        *(byte *)((long)puStack_20 + 10) = *(byte *)((long)puStack_20 + 10) ^ iv[10];
        *(byte *)((long)puStack_20 + 0xb) = *(byte *)((long)puStack_20 + 0xb) ^ iv[0xb];
        *(byte *)((long)puStack_20 + 0xc) = *(byte *)((long)puStack_20 + 0xc) ^ iv[0xc];
        *(byte *)((long)puStack_20 + 0xd) = *(byte *)((long)puStack_20 + 0xd) ^ iv[0xd];
        *(byte *)((long)puStack_20 + 0xe) = *(byte *)((long)puStack_20 + 0xe) ^ iv[0xe];
        *(byte *)((long)puStack_20 + 0xf) = *(byte *)((long)puStack_20 + 0xf) ^ iv[0xf];
        *(undefined8 *)iv = uVar1;
        *(undefined8 *)(iv + 8) = uVar2;
        obuf_local = obuf_local + 0x10;
        puStack_20 = (uint *)((long)puStack_20 + 0x10);
        local_4c = local_4c + -1;
      }
    }
    ibuf_local._4_4_ = 0;
  }
  else {
    ibuf_local._4_4_ = 1;
  }
  return ibuf_local._4_4_;
}

Assistant:

AES_RETURN aes_cbc_decrypt(const unsigned char *ibuf, unsigned char *obuf,
                    int len, unsigned char *iv, const aes_decrypt_ctx ctx[1])
{   unsigned char tmp[AES_BLOCK_SIZE];
    int nb = len >> 4;

    if(len & (AES_BLOCK_SIZE - 1))
        return EXIT_FAILURE;

#if defined( USE_VIA_ACE_IF_PRESENT )

    if(ctx->inf.b[1] == 0xff)
    {   uint8_t *ksp = kd_adr(ctx), *ivp = iv;
        aligned_auto(uint8_t, liv, AES_BLOCK_SIZE, 16);
        via_cwd(cwd, hybrid, dec, 2 * ctx->inf.b[0] - 192);

        if(ALIGN_OFFSET( ctx, 16 ))
            return EXIT_FAILURE;

        if(ALIGN_OFFSET( iv, 16 ))   /* ensure an aligned iv */
        {
            ivp = liv;
            memcpy(liv, iv, AES_BLOCK_SIZE);
        }

        if(!ALIGN_OFFSET( ibuf, 16 ) && !ALIGN_OFFSET( obuf, 16 ) && !ALIGN_OFFSET( iv, 16 ))
        {
            via_cbc_op6(ksp, cwd, ibuf, obuf, nb, ivp);
        }
        else
        {   aligned_auto(uint8_t, buf, BFR_BLOCKS * AES_BLOCK_SIZE, 16);
            uint8_t *ip, *op;

            while(nb)
            {
                int m = (nb > BFR_BLOCKS ? BFR_BLOCKS : nb);

                ip = (ALIGN_OFFSET( ibuf, 16 ) ? buf : ibuf);
                op = (ALIGN_OFFSET( obuf, 16 ) ? buf : obuf);

                if(ip != ibuf)
                    memcpy(buf, ibuf, m * AES_BLOCK_SIZE);

                via_cbc_op6(ksp, cwd, ip, op, m, ivp);

                if(op != obuf)
                    memcpy(obuf, buf, m * AES_BLOCK_SIZE);

                ibuf += m * AES_BLOCK_SIZE;
                obuf += m * AES_BLOCK_SIZE;
                nb -= m;
            }
        }

        if(iv != ivp)
            memcpy(iv, ivp, AES_BLOCK_SIZE);

        return EXIT_SUCCESS;
    }
#endif

#if !defined( ASSUME_VIA_ACE_PRESENT )
# ifdef FAST_BUFFER_OPERATIONS
    if(!ALIGN_OFFSET( obuf, 4 ) && !ALIGN_OFFSET( iv, 4 ))
        while(nb--)
        {
            memcpy(tmp, ibuf, AES_BLOCK_SIZE);
            if(aes_decrypt(ibuf, obuf, ctx) != EXIT_SUCCESS)
                return EXIT_FAILURE;
            lp32(obuf)[0] ^= lp32(iv)[0];
            lp32(obuf)[1] ^= lp32(iv)[1];
            lp32(obuf)[2] ^= lp32(iv)[2];
            lp32(obuf)[3] ^= lp32(iv)[3];
            memcpy(iv, tmp, AES_BLOCK_SIZE);
            ibuf += AES_BLOCK_SIZE;
            obuf += AES_BLOCK_SIZE;
        }
    else
# endif
        while(nb--)
        {
            memcpy(tmp, ibuf, AES_BLOCK_SIZE);
            if(aes_decrypt(ibuf, obuf, ctx) != EXIT_SUCCESS)
                return EXIT_FAILURE;
            obuf[ 0] ^= iv[ 0]; obuf[ 1] ^= iv[ 1];
            obuf[ 2] ^= iv[ 2]; obuf[ 3] ^= iv[ 3];
            obuf[ 4] ^= iv[ 4]; obuf[ 5] ^= iv[ 5];
            obuf[ 6] ^= iv[ 6]; obuf[ 7] ^= iv[ 7];
            obuf[ 8] ^= iv[ 8]; obuf[ 9] ^= iv[ 9];
            obuf[10] ^= iv[10]; obuf[11] ^= iv[11];
            obuf[12] ^= iv[12]; obuf[13] ^= iv[13];
            obuf[14] ^= iv[14]; obuf[15] ^= iv[15];
            memcpy(iv, tmp, AES_BLOCK_SIZE);
            ibuf += AES_BLOCK_SIZE;
            obuf += AES_BLOCK_SIZE;
        }
#endif
    return EXIT_SUCCESS;
}